

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessible.cpp
# Opt level: O2

QDebug operator<<(QDebug d,QAccessibleInterface *iface)

{
  long lVar1;
  _func_int **pp_Var2;
  char cVar3;
  Role role;
  int iVar4;
  uint uVar5;
  QDebug *pQVar6;
  char *t;
  long lVar7;
  long *in_RDX;
  long in_FS_OFFSET;
  QDebug local_90;
  QDebug local_88;
  undefined1 local_80 [24];
  QDebug local_68;
  QDebug local_60;
  QArrayDataPointer<QString> local_58;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)iface);
  if (in_RDX == (long *)0x0) {
    QDebug::operator<<((QDebug *)iface,"QAccessibleInterface(null)");
  }
  else {
    *(undefined1 *)(iface->_vptr_QAccessibleInterface + 6) = 0;
    pQVar6 = QDebug::operator<<((QDebug *)iface,"QAccessibleInterface(");
    Qt::hex(&pQVar6->stream->ts);
    pQVar6 = QDebug::operator<<(pQVar6,in_RDX);
    Qt::dec(&pQVar6->stream->ts);
    cVar3 = (**(code **)(*in_RDX + 0x10))();
    if (cVar3 == '\0') {
      QDebug::operator<<((QDebug *)iface," invalid");
    }
    else {
      pQVar6 = QDebug::operator<<((QDebug *)iface," name=");
      (**(code **)(*in_RDX + 0x60))(&local_58);
      pQVar6 = QDebug::operator<<(pQVar6,(QString *)&local_58);
      QDebug::operator<<(pQVar6,' ');
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      pQVar6 = QDebug::operator<<((QDebug *)iface,"role=");
      role = (**(code **)(*in_RDX + 0x78))();
      t = qAccessibleRoleString(role);
      pQVar6 = QDebug::operator<<(pQVar6,t);
      QDebug::operator<<(pQVar6,' ');
      iVar4 = (**(code **)(*in_RDX + 0x50))();
      if (iVar4 != 0) {
        pQVar6 = QDebug::operator<<((QDebug *)iface,"childc=");
        iVar4 = (**(code **)(*in_RDX + 0x50))();
        pQVar6 = QDebug::operator<<(pQVar6,iVar4);
        QDebug::operator<<(pQVar6,' ');
      }
      lVar7 = (**(code **)(*in_RDX + 0x18))();
      if (lVar7 != 0) {
        pQVar6 = QDebug::operator<<((QDebug *)iface,"obj=");
        local_68.stream = pQVar6->stream;
        (local_68.stream)->ref = (local_68.stream)->ref + 1;
        (**(code **)(*in_RDX + 0x18))();
        operator<<((QDebug *)&local_60,(QObject *)&local_68);
        QDebug::~QDebug(&local_60);
        QDebug::~QDebug(&local_68);
      }
      local_58.d = (Data *)0x0;
      local_58.ptr = (QString *)0x0;
      local_58.size = 0;
      uVar5 = (**(code **)(*in_RDX + 0x80))();
      if ((uVar5 & 4) != 0) {
        Qt::Literals::StringLiterals::operator____s((QString *)local_80,L"focusable",9);
        QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)local_80);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_80);
      }
      if ((uVar5 & 8) != 0) {
        Qt::Literals::StringLiterals::operator____s((QString *)local_80,L"focused",7);
        QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)local_80);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_80);
      }
      if ((uVar5 & 2) != 0) {
        Qt::Literals::StringLiterals::operator____s((QString *)local_80,L"selected",8);
        QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)local_80);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_80);
      }
      if ((uVar5 >> 0x11 & 1) != 0) {
        Qt::Literals::StringLiterals::operator____s((QString *)local_80,L"invisible",9);
        QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)local_80);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_80);
      }
      if (local_58.size != 0) {
        QListSpecialMethods<QString>::join
                  ((QString *)local_80,(QListSpecialMethods<QString> *)&local_58,(QChar)0x7c);
        QDebug::operator<<((QDebug *)iface,(QString *)local_80);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_80);
      }
      if ((uVar5 >> 0x11 & 1) == 0) {
        pQVar6 = QDebug::operator<<((QDebug *)iface,"rect=");
        local_90.stream = pQVar6->stream;
        (local_90.stream)->ref = (local_90.stream)->ref + 1;
        local_80._0_16_ = (**(code **)(*in_RDX + 0x70))();
        operator<<((QDebug *)&local_88,(QRect *)&local_90);
        QDebug::~QDebug(&local_88);
        QDebug::~QDebug(&local_90);
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
    }
    QDebug::operator<<((QDebug *)iface,')');
  }
  pp_Var2 = iface->_vptr_QAccessibleInterface;
  iface->_vptr_QAccessibleInterface = (_func_int **)0x0;
  *(_func_int ***)d.stream = pp_Var2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)d.stream;
  }
  __stack_chk_fail();
}

Assistant:

Q_GUI_EXPORT QDebug operator<<(QDebug d, const QAccessibleInterface *iface)
{
    QDebugStateSaver saver(d);
    if (!iface) {
        d << "QAccessibleInterface(null)";
        return d;
    }
    d.nospace();
    d << "QAccessibleInterface(" << Qt::hex << (const void *) iface << Qt::dec;
    if (iface->isValid()) {
        d << " name=" << iface->text(QAccessible::Name) << ' ';
        d << "role=" << qAccessibleRoleString(iface->role()) << ' ';
        if (iface->childCount())
            d << "childc=" << iface->childCount() << ' ';
        if (iface->object()) {
            d << "obj=" << iface->object();
        }
        QStringList stateStrings;
        QAccessible::State st = iface->state();
        if (st.focusable)
            stateStrings << u"focusable"_s;
        if (st.focused)
            stateStrings << u"focused"_s;
        if (st.selected)
            stateStrings << u"selected"_s;
        if (st.invisible)
            stateStrings << u"invisible"_s;

        if (!stateStrings.isEmpty())
            d << stateStrings.join(u'|');

        if (!st.invisible)
            d << "rect=" << iface->rect();

    } else {
        d << " invalid";
    }
    d << ')';
    return d;
}